

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

int stb_fcmp(char *s1,char *s2)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  FILE *__stream_00;
  
  __stream = fopen(s1,"rb");
  __stream_00 = fopen(s2,"rb");
  if (__stream == (FILE *)0x0 || __stream_00 == (FILE *)0x0) {
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    if (__stream_00 == (FILE *)0x0) {
      uVar1 = (uint)(__stream != (FILE *)0x0);
    }
    else {
      fclose(__stream_00);
      uVar1 = 1;
    }
    return uVar1;
  }
  iVar2 = stb_fcmp_core((FILE *)__stream,(FILE *)__stream_00);
  return iVar2;
}

Assistant:

int stb_fcmp(char *s1, char *s2)
{
   FILE *f = stb__fopen(s1, "rb");
   FILE *g = stb__fopen(s2, "rb");

   if (f == NULL || g == NULL) {
      if (f) fclose(f);
      if (g) {
         fclose(g);
         return STB_TRUE;
      }
      return f != NULL;
   }

   return stb_fcmp_core(f,g);
}